

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

void __thiscall
Js::CompoundString::CompoundString(CompoundString *this,CompoundString *other,bool forAppending)

{
  Type TVar1;
  void *pvVar2;
  Block *pBVar3;
  code *pcVar4;
  Type TVar5;
  bool bVar6;
  charcount_t newLength;
  StaticType *type;
  char16 *pcVar7;
  undefined4 *puVar8;
  
  type = StringCache::GetStringTypeStatic
                   (&((((other->super_LiteralString).super_JavascriptString.super_RecyclableObject.
                        type.ptr)->javascriptLibrary).ptr)->stringCache);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014f1da8;
  pvVar2 = (other->lastBlockInfo).buffer.ptr;
  Memory::Recycler::WBSetBit((char *)&this->lastBlockInfo);
  (this->lastBlockInfo).buffer.ptr = pvVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastBlockInfo);
  TVar5 = (other->lastBlockInfo).charCapacity;
  (this->lastBlockInfo).charLength = (other->lastBlockInfo).charLength;
  (this->lastBlockInfo).charCapacity = TVar5;
  this->directCharLength = other->directCharLength;
  pBVar3 = (other->lastBlock).ptr;
  Memory::Recycler::WBSetBit((char *)&this->lastBlock);
  (this->lastBlock).ptr = pBVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastBlock);
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)other);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1fa,"(!other.IsFinalized())","!other.IsFinalized()");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  newLength = JavascriptString::GetLength((JavascriptString *)other);
  JavascriptString::SetLength((JavascriptString *)this,newLength);
  if (forAppending) {
    TVar1 = other->ownsLastBlock;
    other->ownsLastBlock = false;
    this->ownsLastBlock = TVar1;
    if (TVar1 == false) {
      TakeOwnershipOfLastBlock(this);
      return;
    }
  }
  else {
    this->ownsLastBlock = false;
  }
  return;
}

Assistant:

CompoundString::CompoundString(CompoundString &other, const bool forAppending)
        : LiteralString(other.GetLibrary()->GetStringTypeStatic()),
        lastBlockInfo(other.lastBlockInfo),
        directCharLength(other.directCharLength),
        lastBlock(other.lastBlock)
    {
        Assert(!other.IsFinalized());

        SetLength(other.GetLength());

        if(forAppending)
        {
            // This compound string will be used for appending, so take ownership of the last block. Appends are fast for a
            // compound string that owns the last block.
            const bool ownsLastBlock = other.ownsLastBlock;
            other.ownsLastBlock = false;
            this->ownsLastBlock = ownsLastBlock;
            if(ownsLastBlock)
                return;
            TakeOwnershipOfLastBlock();
            return;
        }

        ownsLastBlock = false;
    }